

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpkview.c
# Opt level: O3

int main(int argc,char **argv)

{
  _Bool _Var1;
  int iVar2;
  FILE *fp;
  CLU *clu;
  int *piVar3;
  char *pcVar4;
  undefined8 uVar5;
  char *fmt;
  char *pcVar6;
  LPStatus status;
  LPStatus local_1c;
  
  app.which_entry = 0;
  app.centered = false;
  app.checkerboard_on = true;
  app.xpk_path = (char *)0x0;
  app.xpk_fp = (FILE *)0x0;
  app.xpk = (XPK *)0x0;
  app.xpkentry = (XPKEntry *)0x0;
  app.xpkentry_tx = (SDL_Texture *)0x0;
  app.entry_rect.x = 0;
  app.entry_rect.y = 0;
  app.entry_rect.w = 0;
  app.entry_rect.h = 0;
  app.checkerboard_rgba = (uint8_t *)0x0;
  if (argc < 3) {
    LPWarn("xpkview","usage: xpkview clufile xpkfile");
  }
  else {
    pcVar6 = argv[1];
    app.xpk_path = argv[2];
    fp = fopen(pcVar6,"rb");
    if (fp == (FILE *)0x0) {
LAB_0010260c:
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fmt = "couldn\'t open CLU file: %s: %s";
    }
    else {
      clu = CLU_NewFromFile((FILE *)fp,&local_1c);
      if (local_1c != LUNAPURPURA_OK) goto LAB_0010260c;
      app.xpk_fp = (FILE *)fopen(app.xpk_path,"rb");
      pcVar6 = app.xpk_path;
      if ((FILE *)app.xpk_fp == (FILE *)0x0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
      }
      else {
        app.xpk = XPK_NewFromFile(app.xpk_fp,&local_1c);
        pcVar6 = app.xpk_path;
        if (local_1c == LUNAPURPURA_OK) {
          XPK_AttachCLU(app.xpk,clu);
          iVar2 = SDL_Init(0x20);
          if (iVar2 == 0) {
            iVar2 = SDL_CreateWindowAndRenderer(0x280,0x1e0,0,&app,0x10d1a0);
            if (iVar2 == 0) {
              SDL_SetWindowTitle(app.window,"Luna Purpura: XPK Viewer");
              SDL_ShowWindow(app.window);
              iVar2 = 1;
              _Var1 = XPKView_CreateCheckerboardPattern();
              if (_Var1) {
                XPKView_LoadXPKEntry();
                uVar5 = SDL_CreateRGBSurfaceWithFormatFrom
                                  (app.checkerboard_rgba,0x20,0x20,0x20,0x80,0x16762004);
                free(app.checkerboard_rgba);
                app.checkerboard_tx =
                     (SDL_Texture *)SDL_CreateTextureFromSurface(app.renderer,uVar5);
                SDL_FreeSurface(uVar5);
                XPKView_MainLoop();
                iVar2 = 0;
              }
              goto LAB_00102638;
            }
            uVar5 = SDL_GetError();
            pcVar6 = "Couldn\'t create window and/or renderer: %s";
          }
          else {
            uVar5 = SDL_GetError();
            pcVar6 = "Couldn\'t initialize SDL: %s";
          }
          LPWarn("xpkview",pcVar6,uVar5);
          goto LAB_00102633;
        }
        pcVar4 = LPStatusString(local_1c);
      }
      fmt = "couldn\'t open XPK file: %s: %s";
    }
    LPWarn("xpkview",fmt,pcVar6,pcVar4);
  }
LAB_00102633:
  iVar2 = 1;
LAB_00102638:
  XPKView_Shutdown();
  return iVar2;
}

Assistant:

int
main(int argc, char *argv[])
{
	app.which_entry = 0;
	app.xpk_path = NULL;
	app.xpk_fp = NULL;
	app.checkerboard_rgba = NULL;
	app.xpk = NULL;
	app.xpkentry = NULL;
	app.xpkentry_tx = NULL;
	app.entry_rect = (SDL_Rect){0, 0, 0, 0};
	app.centered = false;
	app.checkerboard_on = true;

	if (argc < 3) {
		LPWarn(MSGPREFIX, "usage: xpkview clufile xpkfile");
		goto fail;
	}

	char *clu_path = argv[1];
	app.xpk_path = argv[2];

	FILE *clu_fp = fopen(clu_path, "rb");
	if (!clu_fp) {
		LPWarn(MSGPREFIX, "couldn't open CLU file: %s: %s", clu_path, strerror(errno));
		goto fail;
	}

	LPStatus status;

	CLU *clu = CLU_NewFromFile(clu_fp, &status);
	if (status != LUNAPURPURA_OK) {
		LPWarn(MSGPREFIX, "couldn't open CLU file: %s: %s", clu_path, strerror(errno));
		goto fail;
	}

	app.xpk_fp = fopen(app.xpk_path, "rb");
	if (!app.xpk_fp) {
		LPWarn(MSGPREFIX, "couldn't open XPK file: %s: %s", app.xpk_path, strerror(errno));
		goto fail;
	}

	app.xpk = XPK_NewFromFile(app.xpk_fp, &status);
	if (status != LUNAPURPURA_OK) {
		LPWarn(MSGPREFIX, "couldn't open XPK file: %s: %s", app.xpk_path, LPStatusString(status));
		goto fail;
	}

	XPK_AttachCLU(app.xpk, clu);

	if (!XPKView_Setup()) {
		goto fail;
	}

	if (!XPKView_CreateCheckerboardPattern()) {
		goto fail;
	}

	XPKView_LoadXPKEntry();

	/* Obtain the checkerboard texture. */
	SDL_Surface *checkerboard_surf = SDL_CreateRGBSurfaceWithFormatFrom(
		app.checkerboard_rgba, 32, 32, 32, 32*4, SDL_PIXELFORMAT_RGBA32
	);
	free(app.checkerboard_rgba);
	app.checkerboard_tx = SDL_CreateTextureFromSurface(app.renderer, checkerboard_surf);
	SDL_FreeSurface(checkerboard_surf);

	if (!XPKView_MainLoop()) {
		goto fail;
	}

	XPKView_Shutdown();
	return EXIT_SUCCESS;

fail:
	XPKView_Shutdown();
	return EXIT_FAILURE;
}